

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O1

SPIRConstant * __thiscall
diligent_spirv_cross::Variant::get<diligent_spirv_cross::SPIRConstant>(Variant *this)

{
  CompilerError *this_00;
  
  if ((SPIRConstant *)this->holder == (SPIRConstant *)0x0) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"nullptr");
  }
  else {
    if (this->type == TypeConstant) {
      return (SPIRConstant *)this->holder;
    }
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Bad cast");
  }
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

T &get()
	{
		if (!holder)
			SPIRV_CROSS_THROW("nullptr");
		if (static_cast<Types>(T::type) != type)
			SPIRV_CROSS_THROW("Bad cast");
		return *static_cast<T *>(holder);
	}